

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBlock::TryAllocFromFreeList
          (LargeHeapBlock *this,size_t size,ObjectInfoBits attributes)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LargeHeapBlock *heapBlock;
  LargeHeapBlockFreeListEntry *next;
  char *memBlock;
  LargeHeapBlockFreeListEntry *freeListEntry;
  LargeHeapBlockFreeListEntry **prev;
  ObjectInfoBits attributes_local;
  size_t size_local;
  LargeHeapBlock *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x1dd,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  freeListEntry = (LargeHeapBlockFreeListEntry *)&(this->freeList).entries;
  memBlock = (char *)(this->freeList).entries;
  next = (LargeHeapBlockFreeListEntry *)0x0;
  do {
    if (memBlock == (char *)0x0) {
LAB_009621f9:
      if ((this->freeList).entries == (LargeHeapBlockFreeListEntry *)0x0) {
        LargeHeapBucket::UnregisterFreeList(this->bucket,&this->freeList);
      }
      return (char *)next;
    }
    uVar1 = *(undefined8 *)(memBlock + 0x18);
    if ((size <= *(ulong *)(memBlock + 8)) &&
       (next = (LargeHeapBlockFreeListEntry *)
               AllocFreeListEntry(*(LargeHeapBlock **)(memBlock + 0x10),size,attributes,
                                  (LargeHeapBlockFreeListEntry *)memBlock),
       next != (LargeHeapBlockFreeListEntry *)0x0)) {
      *(undefined8 *)freeListEntry = uVar1;
      goto LAB_009621f9;
    }
    freeListEntry = (LargeHeapBlockFreeListEntry *)(memBlock + 0x18);
    memBlock = *(char **)(memBlock + 0x18);
  } while( true );
}

Assistant:

char*
LargeHeapBlock::TryAllocFromFreeList(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeListEntry** prev = &this->freeList.entries;
    LargeHeapBlockFreeListEntry* freeListEntry = this->freeList.entries;

    char* memBlock = nullptr;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlockFreeListEntry* next = freeListEntry->next;
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        if (freeListEntry->objectSize >= size)
        {
            memBlock = heapBlock->AllocFreeListEntry(size, attributes, freeListEntry);
            if (memBlock)
            {
                (*prev) = next;

                break;
            }
        }

        prev = &freeListEntry->next;
        freeListEntry = freeListEntry->next;
    }

    if (this->freeList.entries == nullptr)
    {
        this->bucket->UnregisterFreeList(&this->freeList);
    }

    return memBlock;
}